

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractproxymodel.cpp
# Opt level: O2

void __thiscall
QAbstractProxyModelPrivate::mapDropCoordinatesToSource
          (QAbstractProxyModelPrivate *this,int row,int column,QModelIndex *parent,int *sourceRow,
          int *sourceColumn,QModelIndex *sourceParent)

{
  QObject *pQVar1;
  QAbstractItemModel *pQVar2;
  int iVar3;
  long in_FS_OFFSET;
  QModelIndex local_90;
  QModelIndex local_78;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  QAbstractItemModel *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->super_QAbstractItemModelPrivate).super_QObjectPrivate.super_QObjectData.q_ptr;
  *sourceRow = -1;
  *sourceColumn = -1;
  if ((column & row) == 0xffffffff) {
    (*pQVar1->_vptr_QObject[0x32])(&local_58,pQVar1,parent);
    (sourceParent->m).ptr = local_48;
    sourceParent->r = local_58;
    sourceParent->c = uStack_54;
    sourceParent->i = CONCAT44(uStack_4c,uStack_50);
  }
  else {
    iVar3 = (*pQVar1->_vptr_QObject[0xf])(pQVar1,parent);
    if (iVar3 == row) {
      (*pQVar1->_vptr_QObject[0x32])(&local_58,pQVar1,parent);
      (sourceParent->m).ptr = local_48;
      sourceParent->r = local_58;
      sourceParent->c = uStack_54;
      sourceParent->i = CONCAT44(uStack_4c,uStack_50);
      QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
      ::value(&this->model);
      pQVar2 = (this->model).super_QPropertyData<QAbstractItemModel_*>.val;
      iVar3 = (*(pQVar2->super_QObject)._vptr_QObject[0xf])(pQVar2,sourceParent);
      *sourceRow = iVar3;
    }
    else {
      local_48 = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
      local_58 = 0xaaaaaaaa;
      uStack_54 = 0xaaaaaaaa;
      uStack_50 = 0xaaaaaaaa;
      uStack_4c = 0xaaaaaaaa;
      (*pQVar1->_vptr_QObject[0xc])(&local_58,pQVar1,(ulong)(uint)row,(ulong)(uint)column,parent);
      local_78.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
      local_78.r = -0x55555556;
      local_78.c = -0x55555556;
      local_78.i._0_4_ = 0xaaaaaaaa;
      local_78.i._4_4_ = 0xaaaaaaaa;
      (*pQVar1->_vptr_QObject[0x32])(&local_78,pQVar1,&local_58);
      *sourceRow = local_78.r;
      *sourceColumn = local_78.c;
      QModelIndex::parent(&local_90,&local_78);
      (sourceParent->m).ptr = local_90.m.ptr;
      sourceParent->r = local_90.r;
      sourceParent->c = local_90.c;
      sourceParent->i = local_90.i;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractProxyModelPrivate::mapDropCoordinatesToSource(int row, int column, const QModelIndex &parent,
                                                            int *sourceRow, int *sourceColumn, QModelIndex *sourceParent) const
{
    Q_Q(const QAbstractProxyModel);
    *sourceRow = -1;
    *sourceColumn = -1;
    if (row == -1 && column == -1) {
        *sourceParent = q->mapToSource(parent);
    } else if (row == q->rowCount(parent)) {
        *sourceParent = q->mapToSource(parent);
        *sourceRow = model->rowCount(*sourceParent);
    } else {
        QModelIndex proxyIndex = q->index(row, column, parent);
        QModelIndex sourceIndex = q->mapToSource(proxyIndex);
        *sourceRow = sourceIndex.row();
        *sourceColumn = sourceIndex.column();
        *sourceParent = sourceIndex.parent();
    }
}